

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrDestroySpatialAnchorStoreConnectionMSFT
                   (XrSpatialAnchorStoreConnectionMSFT spatialAnchorStore)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_spatialanchorstoreconnectionmsft_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrSpatialAnchorStoreConnectionMSFT spatialAnchorStore_local;
  
  pVar2 = HandleInfo<XrSpatialAnchorStoreConnectionMSFT_T_*>::getWithInstanceInfo
                    (&g_spatialanchorstoreconnectionmsft_info,spatialAnchorStore);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroySpatialAnchorStoreConnectionMSFT)
                    (spatialAnchorStore);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_spatialanchorstoreconnectionmsft_info.
                super_HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>
               ,spatialAnchorStore);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroySpatialAnchorStoreConnectionMSFT(
    XrSpatialAnchorStoreConnectionMSFT spatialAnchorStore) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_spatialanchorstoreconnectionmsft_info.getWithInstanceInfo(spatialAnchorStore);
        GenValidUsageXrHandleInfo *gen_spatialanchorstoreconnectionmsft_info = info_with_instance.first;
        (void)gen_spatialanchorstoreconnectionmsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroySpatialAnchorStoreConnectionMSFT(spatialAnchorStore);
        if (XR_SUCCEEDED(result)) {
            g_spatialanchorstoreconnectionmsft_info.erase(spatialAnchorStore);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}